

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::CheckKeyword(cmFileInstaller *this,string *arg)

{
  cmCommand *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0;
  ostringstream local_190 [376];
  
  bVar1 = std::operator==(arg,"TYPE");
  if (bVar1) {
    if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
      (this->super_cmFileCopier).Doing = 10;
      return true;
    }
  }
  else {
    bVar1 = std::operator==(arg,"FILES");
    if (bVar1) {
      if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
        (this->super_cmFileCopier).Doing = 4;
        return true;
      }
    }
    else {
      bVar1 = std::operator==(arg,"RENAME");
      if (bVar1) {
        if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
          (this->super_cmFileCopier).Doing = 0xb;
          return true;
        }
      }
      else {
        bVar1 = std::operator==(arg,"OPTIONAL");
        if (bVar1) {
          if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
            (this->super_cmFileCopier).Doing = 0;
            this->Optional = true;
            return true;
          }
        }
        else {
          bVar1 = std::operator==(arg,"MESSAGE_ALWAYS");
          if (bVar1) {
            if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
              (this->super_cmFileCopier).Doing = 0;
              this->MessageAlways = true;
              return true;
            }
          }
          else {
            bVar1 = std::operator==(arg,"MESSAGE_LAZY");
            if (bVar1) {
              if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                (this->super_cmFileCopier).Doing = 0;
                this->MessageLazy = true;
                return true;
              }
            }
            else {
              bVar1 = std::operator==(arg,"MESSAGE_NEVER");
              if (bVar1) {
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 0;
                  this->MessageNever = true;
                  return true;
                }
              }
              else {
                bVar1 = std::operator==(arg,"PERMISSIONS");
                if (bVar1) {
                  if ((this->super_cmFileCopier).CurrentMatchRule != (MatchRule *)0x0) {
                    (this->super_cmFileCopier).Doing = 9;
                    return true;
                  }
                  (this->super_cmFileCopier).Doing = 7;
                  (this->super_cmFileCopier).UseGivenPermissionsFile = true;
                  return true;
                }
                bVar1 = std::operator==(arg,"DIR_PERMISSIONS");
                if (!bVar1) {
                  bVar1 = std::operator==(arg,"COMPONENTS");
                  if (((!bVar1) && (bVar1 = std::operator==(arg,"CONFIGURATIONS"), !bVar1)) &&
                     (bVar1 = std::operator==(arg,"PROPERTIES"), !bVar1)) {
                    bVar1 = cmFileCopier::CheckKeyword(&this->super_cmFileCopier,arg);
                    return bVar1;
                  }
                  std::__cxx11::ostringstream::ostringstream(local_190);
                  poVar2 = std::operator<<((ostream *)local_190,"INSTALL called with old-style ");
                  poVar2 = std::operator<<(poVar2,(string *)arg);
                  poVar2 = std::operator<<(poVar2," argument.  ");
                  poVar2 = std::operator<<(poVar2,
                                           "This script was generated with an older version of CMake.  "
                                          );
                  std::operator<<(poVar2,"Re-run this cmake version on your build tree.");
                  this_00 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(this_00,&local_1b0);
                  std::__cxx11::string::~string((string *)&local_1b0);
                  (this->super_cmFileCopier).Doing = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_190);
                  return true;
                }
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 8;
                  (this->super_cmFileCopier).UseGivenPermissionsDir = true;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
  return true;
}

Assistant:

bool cmFileInstaller::CheckKeyword(std::string const& arg)
{
  if (arg == "TYPE") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingType;
    }
  } else if (arg == "FILES") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingFiles;
    }
  } else if (arg == "RENAME") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingRename;
    }
  } else if (arg == "OPTIONAL") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->Optional = true;
    }
  } else if (arg == "MESSAGE_ALWAYS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageAlways = true;
    }
  } else if (arg == "MESSAGE_LAZY") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageLazy = true;
    }
  } else if (arg == "MESSAGE_NEVER") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageNever = true;
    }
  } else if (arg == "PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->Doing = DoingPermissionsMatch;
    } else {
      // file(INSTALL) aliases PERMISSIONS to FILE_PERMISSIONS
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
    }
  } else if (arg == "DIR_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      // file(INSTALL) aliases DIR_PERMISSIONS to DIRECTORY_PERMISSIONS
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
    }
  } else if (arg == "COMPONENTS" || arg == "CONFIGURATIONS" ||
             arg == "PROPERTIES") {
    std::ostringstream e;
    e << "INSTALL called with old-style " << arg << " argument.  "
      << "This script was generated with an older version of CMake.  "
      << "Re-run this cmake version on your build tree.";
    this->FileCommand->SetError(e.str());
    this->Doing = DoingError;
  } else {
    return this->cmFileCopier::CheckKeyword(arg);
  }
  return true;
}